

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCMatVec.h
# Opt level: O2

void chrono::collision::Meigen(PQP_REAL (*vout) [3],PQP_REAL *dout,PQP_REAL (*a) [3])

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  PQP_REAL *pPVar5;
  PQP_REAL *pPVar6;
  PQP_REAL *pPVar7;
  PQP_REAL *pPVar8;
  PQP_REAL *pPVar9;
  PQP_REAL *pPVar10;
  PQP_REAL *pPVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  PQP_REAL *pPVar15;
  PQP_REAL *pPVar16;
  PQP_REAL *pPVar17;
  uint uVar18;
  PQP_REAL *pPVar19;
  PQP_REAL *pPVar20;
  PQP_REAL *pPVar21;
  PQP_REAL *pPVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  PQP_REAL d [3];
  ulong local_120;
  PQP_REAL z [3];
  PQP_REAL v [3] [3];
  PQP_REAL b [3];
  
  v[2][2] = 1.0;
  v[1][1] = 1.0;
  v[0][0] = 1.0;
  v[0][1] = 0.0;
  v[0][2] = 0.0;
  v[1][0] = 0.0;
  v[2][1] = 0.0;
  v[1][2] = 0.0;
  v[2][0] = 0.0;
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
    uVar1 = *(undefined8 *)((long)*a + lVar4 * 4);
    *(undefined8 *)((long)z + lVar4) = 0;
    *(undefined8 *)((long)b + lVar4) = uVar1;
    *(undefined8 *)((long)d + lVar4) = uVar1;
  }
  auVar23._8_8_ = 0x7fffffffffffffff;
  auVar23._0_8_ = 0x7fffffffffffffff;
  uVar18 = 0;
  do {
    if (uVar18 == 0x32) {
      fwrite("eigen: too many iterations in Jacobi transform.\n",0x30,1,_stderr);
      return;
    }
    dVar24 = 0.0;
    lVar4 = 0;
    pPVar5 = *a;
    for (; lVar4 != 3; lVar4 = lVar4 + 1) {
      lVar13 = 1;
      while (lVar4 + lVar13 != 3) {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = pPVar5[lVar13];
        lVar13 = lVar13 + 1;
        auVar25 = vandpd_avx(auVar25,auVar23);
        dVar24 = dVar24 + auVar25._0_8_;
      }
      pPVar5 = pPVar5 + 4;
    }
    if ((dVar24 == 0.0) && (!NAN(dVar24))) {
      McM(vout,v);
      *dout = d[0];
      dout[1] = d[1];
      dout[2] = d[2];
      return;
    }
    pPVar21 = v[0];
    pPVar5 = v[0];
    lVar13 = 0;
    local_120 = 1;
    lVar4 = 0;
    pPVar7 = a[1] + 1;
    pPVar9 = a[1] + 2;
    pPVar16 = *a;
    pPVar17 = *a;
    pPVar19 = *a + 2;
    pPVar11 = *a;
    for (; pPVar21 = pPVar21 + 1, pPVar11 = pPVar11 + 1, pPVar6 = pPVar11, pPVar8 = pPVar7,
        pPVar10 = pPVar9, uVar12 = local_120, pPVar20 = pPVar19, pPVar22 = pPVar21, lVar4 != 3;
        lVar4 = lVar4 + 1) {
      for (; uVar12 != 3; uVar12 = uVar12 + 1) {
        pPVar15 = a[lVar4] + uVar12;
        dVar2 = *pPVar15;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar2;
        auVar25 = vandpd_avx(auVar31,auVar23);
        dVar3 = auVar25._0_8_ * 100.0;
        if (uVar18 < 4) {
LAB_00d7cae5:
          if ((double)((ulong)(uVar18 < 3) * (long)((dVar24 * 0.2) / 9.0)) < auVar25._0_8_) {
            dVar28 = d[uVar12] - d[lVar4];
            auVar29._8_8_ = 0;
            auVar29._0_8_ = dVar28;
            auVar25 = vandpd_avx(auVar29,auVar23);
            dVar39 = auVar25._0_8_;
            if ((dVar3 + dVar39 != dVar39) || (NAN(dVar3 + dVar39) || NAN(dVar39))) {
              auVar26._0_8_ = (dVar28 * 0.5) / dVar2;
              auVar26._8_8_ = 0;
              auVar25 = vandpd_avx(auVar26,auVar23);
              auVar31 = vfmadd213sd_fma(auVar26,auVar26,ZEXT816(0x3ff0000000000000));
              auVar31 = vsqrtsd_avx(auVar31,auVar31);
              auVar40._0_8_ = 1.0 / (auVar25._0_8_ + auVar31._0_8_);
              auVar40._8_8_ = 0;
              if (auVar26._0_8_ < 0.0) {
                auVar40._0_8_ = -auVar40._0_8_;
                auVar40._8_8_ = 0x8000000000000000;
              }
            }
            else {
              auVar40._0_8_ = dVar2 / dVar28;
              auVar40._8_8_ = 0;
            }
            auVar25 = vfmadd213sd_fma(auVar40,auVar40,ZEXT816(0x3ff0000000000000));
            dVar2 = auVar40._0_8_ * dVar2;
            auVar25 = vsqrtsd_avx(auVar25,auVar25);
            d[lVar4] = d[lVar4] - dVar2;
            dVar28 = 1.0 / auVar25._0_8_;
            dVar3 = auVar40._0_8_ * dVar28;
            auVar30._0_8_ = dVar3 / (dVar28 + 1.0);
            auVar30._8_8_ = 0;
            z[lVar4] = z[lVar4] - dVar2;
            d[uVar12] = dVar2 + d[uVar12];
            z[uVar12] = dVar2 + z[uVar12];
            *pPVar15 = 0.0;
            auVar32._0_8_ = -dVar3;
            auVar32._8_8_ = 0x8000000000000000;
            for (lVar14 = 0; auVar27._8_8_ = 0, auVar27._0_8_ = dVar3, lVar13 != lVar14;
                lVar14 = lVar14 + 0x18) {
              auVar35._8_8_ = 0;
              auVar35._0_8_ = *(ulong *)((long)pPVar17 + lVar14);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)((long)pPVar6 + lVar14);
              auVar25 = vfmadd213sd_fma(auVar30,auVar35,auVar41);
              auVar25 = vfmadd213sd_fma(auVar25,auVar32,auVar35);
              auVar31 = vfnmadd231sd_fma(auVar35,auVar41,auVar30);
              auVar31 = vfmadd213sd_fma(auVar31,auVar27,auVar41);
              *(long *)((long)pPVar17 + lVar14) = auVar25._0_8_;
              *(long *)((long)pPVar6 + lVar14) = auVar31._0_8_;
            }
            pPVar15 = pPVar8;
            for (lVar14 = 1; (ulong)(lVar4 + lVar14) < uVar12; lVar14 = lVar14 + 1) {
              auVar36._8_8_ = 0;
              auVar36._0_8_ = pPVar16[lVar14];
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *pPVar15;
              auVar25 = vfmadd213sd_fma(auVar30,auVar36,auVar42);
              auVar25 = vfmadd213sd_fma(auVar25,auVar32,auVar36);
              auVar31 = vfnmadd231sd_fma(auVar36,auVar42,auVar30);
              auVar31 = vfmadd213sd_fma(auVar31,auVar27,auVar42);
              pPVar16[lVar14] = auVar25._0_8_;
              *pPVar15 = auVar31._0_8_;
              pPVar15 = pPVar15 + 3;
            }
            for (lVar14 = 0; uVar12 + lVar14 < 2; lVar14 = lVar14 + 1) {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = pPVar20[lVar14];
              auVar43._8_8_ = 0;
              auVar43._0_8_ = pPVar10[lVar14];
              auVar25 = vfmadd213sd_fma(auVar30,auVar37,auVar43);
              auVar25 = vfmadd213sd_fma(auVar25,auVar32,auVar37);
              auVar31 = vfnmadd231sd_fma(auVar37,auVar43,auVar30);
              auVar31 = vfmadd213sd_fma(auVar31,auVar27,auVar43);
              pPVar20[lVar14] = auVar25._0_8_;
              pPVar10[lVar14] = auVar31._0_8_;
            }
            for (lVar14 = 0; lVar14 != 0x48; lVar14 = lVar14 + 0x18) {
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)((long)pPVar5 + lVar14);
              auVar44._8_8_ = 0;
              auVar44._0_8_ = *(ulong *)((long)pPVar22 + lVar14);
              auVar25 = vfmadd213sd_fma(auVar30,auVar38,auVar44);
              auVar25 = vfmadd213sd_fma(auVar25,auVar32,auVar38);
              auVar31 = vfnmadd231sd_fma(auVar38,auVar44,auVar30);
              auVar31 = vfmadd213sd_fma(auVar31,auVar27,auVar44);
              *(long *)((long)pPVar5 + lVar14) = auVar25._0_8_;
              *(long *)((long)pPVar22 + lVar14) = auVar31._0_8_;
            }
          }
        }
        else {
          auVar33._8_8_ = 0;
          auVar33._0_8_ = d[lVar4];
          auVar31 = vandpd_avx(auVar33,auVar23);
          dVar28 = auVar31._0_8_;
          if ((dVar3 + dVar28 != dVar28) || (NAN(dVar3 + dVar28) || NAN(dVar28))) goto LAB_00d7cae5;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = d[uVar12];
          auVar31 = vandpd_avx(auVar34,auVar23);
          dVar28 = auVar31._0_8_;
          if ((dVar3 + dVar28 != dVar28) || (NAN(dVar3 + dVar28) || NAN(dVar28))) goto LAB_00d7cae5;
          *pPVar15 = 0.0;
        }
        pPVar6 = pPVar6 + 1;
        pPVar8 = pPVar8 + 1;
        pPVar10 = pPVar10 + 4;
        pPVar20 = pPVar20 + 1;
        pPVar22 = pPVar22 + 1;
      }
      local_120 = local_120 + 1;
      lVar13 = lVar13 + 0x18;
      pPVar17 = pPVar17 + 1;
      pPVar16 = pPVar16 + 4;
      pPVar5 = pPVar5 + 1;
      pPVar7 = pPVar7 + 4;
      pPVar9 = pPVar9 + 4;
      pPVar19 = pPVar19 + 4;
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dVar24 = z[lVar4];
      z[lVar4] = 0.0;
      dVar2 = b[lVar4];
      b[lVar4] = dVar24 + dVar2;
      d[lVar4] = dVar24 + dVar2;
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void inline Meigen(PQP_REAL vout[3][3], PQP_REAL dout[3], PQP_REAL a[3][3]) {
    int n = 3;
    int j, iq, ip, i;
    PQP_REAL tresh, theta, tau, t, sm, s, h, g, c;
    int nrot;
    PQP_REAL b[3];
    PQP_REAL z[3];
    PQP_REAL v[3][3];
    PQP_REAL d[3];

    Midentity(v);
    for (ip = 0; ip < n; ip++) {
        b[ip] = a[ip][ip];
        d[ip] = a[ip][ip];
        z[ip] = 0.0;
    }

    nrot = 0;

    for (i = 0; i < 50; i++) {
        sm = 0.0;
        for (ip = 0; ip < n; ip++)
            for (iq = ip + 1; iq < n; iq++)
                sm += fabs(a[ip][iq]);
        if (sm == 0.0) {
            McM(vout, v);
            VcV(dout, d);
            return;
        }

        if (i < 3)
            tresh = (PQP_REAL)0.2 * sm / (n * n);
        else
            tresh = 0.0;

        for (ip = 0; ip < n; ip++)
            for (iq = ip + 1; iq < n; iq++) {
                g = (PQP_REAL)100.0 * fabs(a[ip][iq]);
                if (i > 3 && fabs(d[ip]) + g == fabs(d[ip]) && fabs(d[iq]) + g == fabs(d[iq]))
                    a[ip][iq] = 0.0;
                else if (fabs(a[ip][iq]) > tresh) {
                    h = d[iq] - d[ip];
                    if (fabs(h) + g == fabs(h))
                        t = (a[ip][iq]) / h;
                    else {
                        theta = (PQP_REAL)0.5 * h / (a[ip][iq]);
                        t = (PQP_REAL)(1.0 / (fabs(theta) + sqrt(1.0 + theta * theta)));
                        if (theta < 0.0)
                            t = -t;
                    }
                    c = (PQP_REAL)1.0 / sqrt(1 + t * t);
                    s = t * c;
                    tau = s / ((PQP_REAL)1.0 + c);
                    h = t * a[ip][iq];
                    z[ip] -= h;
                    z[iq] += h;
                    d[ip] -= h;
                    d[iq] += h;
                    a[ip][iq] = 0.0;
                    for (j = 0; j < ip; j++) {
                        ROTATE(a, j, ip, j, iq);
                    }
                    for (j = ip + 1; j < iq; j++) {
                        ROTATE(a, ip, j, j, iq);
                    }
                    for (j = iq + 1; j < n; j++) {
                        ROTATE(a, ip, j, iq, j);
                    }
                    for (j = 0; j < n; j++) {
                        ROTATE(v, j, ip, j, iq);
                    }
                    nrot++;
                }
            }
        for (ip = 0; ip < n; ip++) {
            b[ip] += z[ip];
            d[ip] = b[ip];
            z[ip] = 0.0;
        }
    }

    fprintf(stderr, "eigen: too many iterations in Jacobi transform.\n");

    return;
}